

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O0

exr_result_t exr_set_zip_compression_level(exr_context_t ctxt,int part_index,int level)

{
  int in_EDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  exr_result_t local_4;
  
  if (in_RDI == (_internal_exr_context *)0x0) {
    local_4 = 2;
  }
  else {
    internal_exr_lock(in_RDI);
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      internal_exr_unlock(in_RDI);
      local_4 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else if (in_RDI->mode == '\x01') {
      if ((in_EDX < -1) || (9 < in_EDX)) {
        internal_exr_unlock(in_RDI);
        local_4 = (*in_RDI->report_error)(in_RDI,3,"Invalid zip level specified");
      }
      else {
        in_RDI->parts[(int)in_ESI]->zip_compression_level = in_EDX;
        internal_exr_unlock(in_RDI);
        local_4 = 0;
      }
    }
    else {
      internal_exr_unlock(in_RDI);
      local_4 = (*in_RDI->standard_error)(in_RDI,8);
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_set_zip_compression_level (exr_context_t ctxt, int part_index, int level)
{
    exr_result_t rv;
    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (pctxt->mode != EXR_CONTEXT_WRITE)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));

    if (level >= -1 && level < 10)
    {
        part->zip_compression_level = level;
        rv                          = EXR_ERR_SUCCESS;
    }
    else
    {
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->report_error (
            pctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid zip level specified"));
    }

    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}